

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O0

void __thiscall
create_filter(std::__cxx11::string_const&)::$_3::__3(__3 *this,anon_class_32_1_de1dbfd4 *param_1)

{
  anon_class_32_1_de1dbfd4 *param_1_local;
  anon_class_32_1_de1dbfd4 *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  return;
}

Assistant:

void object_tools::save_skl(xray_re::xr_object& object, const char* source, const cl_parser& cl) const
{
	std::string motion_name;
	cl.get_string("-skl", motion_name);

	auto filter = create_filter(motion_name);

	bool found = false;
	for (auto el : object.motions()) {
		if (!filter(el->name()))
			continue;

		std::string name{ el->name() };
		std::string target = m_output_file.empty() ? m_output_folder + name + ".skl" : m_output_file;
		if (!el->save_skl(target.c_str()))
			msg("can't save %s", target.c_str());

		found = true;
	}
	if (!found)
		msg("can't find motion %s", motion_name.c_str());
}